

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::NavigationBar::hideEvent(NavigationBar *this,QHideEvent *e)

{
  if ((*(byte *)(*(long *)&this->field_0x20 + 9) & 0x80) == 0) {
    QList<int>::clear(&(((this->d).d)->backStack).super_QList<int>);
    QList<int>::clear(&(((this->d).d)->forwardStack).super_QList<int>);
    QWidget::hide();
    QWidget::hide();
  }
  e[0xc] = (QHideEvent)0x1;
  return;
}

Assistant:

void
NavigationBar::hideEvent( QHideEvent * e )
{
	if( !isVisible() )
	{
		d->backStack.clear();
		d->forwardStack.clear();

		d->left->hide();
		d->right->hide();
	}

	e->accept();
}